

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

uint __thiscall ON_Mesh::AppendDuplicateVertex(ON_Mesh *this,uint vertex_index)

{
  uint uVar1;
  ON_3fPoint *pOVar2;
  ON_3dPoint *pOVar3;
  ON_3fVector *pOVar4;
  ON_2fPoint *pOVar5;
  ON_2dPoint *pOVar6;
  ON_SurfaceCurvature *pOVar7;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar8;
  bool *pbVar9;
  bool local_85;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_84;
  undefined1 auStack_80 [3];
  bool H;
  ON_Color C;
  ON_SurfaceCurvature K;
  ON_2dPoint S;
  ON_2fPoint T;
  ON_3fVector N;
  ON_3dPoint D;
  ON_3fPoint V;
  uint vertex_count;
  uint vertex_index_local;
  ON_Mesh *this_local;
  
  this_local._4_4_ = VertexUnsignedCount(this);
  if (vertex_index < this_local._4_4_) {
    uVar1 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>)
    ;
    if (this_local._4_4_ == uVar1) {
      pOVar2 = ON_SimpleArray<ON_3fPoint>::operator[]
                         (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,vertex_index);
      D.z._4_4_ = pOVar2->x;
      unique0x00012004 = pOVar2->y;
      ON_SimpleArray<ON_3fPoint>::Append
                (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,(ON_3fPoint *)((long)&D.z + 4));
    }
    uVar1 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                      (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
    if (this_local._4_4_ == uVar1) {
      pOVar3 = ON_SimpleArray<ON_3dPoint>::operator[]
                         (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,vertex_index);
      N._4_8_ = pOVar3->x;
      D.x = pOVar3->y;
      D.y = pOVar3->z;
      ON_SimpleArray<ON_3dPoint>::Append
                (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)&N.y);
    }
    uVar1 = ON_SimpleArray<ON_3fVector>::UnsignedCount
                      (&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
    if (this_local._4_4_ == uVar1) {
      pOVar4 = ON_SimpleArray<ON_3fVector>::operator[]
                         (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,vertex_index);
      T.x = pOVar4->x;
      T.y = pOVar4->y;
      N.x = pOVar4->z;
      ON_SimpleArray<ON_3fVector>::Append
                (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)&T);
    }
    uVar1 = ON_SimpleArray<ON_2fPoint>::UnsignedCount(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>)
    ;
    if (this_local._4_4_ == uVar1) {
      pOVar5 = ON_SimpleArray<ON_2fPoint>::operator[]
                         (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,vertex_index);
      unique0x00012000 = *pOVar5;
      ON_SimpleArray<ON_2fPoint>::Append
                (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)((long)&S.y + 4));
    }
    uVar1 = ON_SimpleArray<ON_2dPoint>::UnsignedCount(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>)
    ;
    if (this_local._4_4_ == uVar1) {
      pOVar6 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,vertex_index);
      K.k2 = pOVar6->x;
      S.x = pOVar6->y;
      ON_SimpleArray<ON_2dPoint>::Append
                (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(ON_2dPoint *)&K.k2);
    }
    uVar1 = ON_SimpleArray<ON_SurfaceCurvature>::UnsignedCount(&this->m_K);
    if (this_local._4_4_ == uVar1) {
      pOVar7 = ON_SimpleArray<ON_SurfaceCurvature>::operator[](&this->m_K,vertex_index);
      _auStack_80 = pOVar7->k1;
      K.k1 = pOVar7->k2;
      ON_SimpleArray<ON_SurfaceCurvature>::Append(&this->m_K,(ON_SurfaceCurvature *)auStack_80);
    }
    uVar1 = ON_SimpleArray<ON_Color>::UnsignedCount(&this->m_C);
    if (this_local._4_4_ == uVar1) {
      paVar8 = &ON_SimpleArray<ON_Color>::operator[](&this->m_C,vertex_index)->field_0;
      local_84 = *paVar8;
      ON_SimpleArray<ON_Color>::Append(&this->m_C,(ON_Color *)&local_84);
    }
    uVar1 = ON_SimpleArray<bool>::UnsignedCount(&this->m_H);
    if (this_local._4_4_ == uVar1) {
      pbVar9 = ON_SimpleArray<bool>::operator[](&this->m_H,vertex_index);
      local_85 = (bool)(*pbVar9 & 1);
      ON_SimpleArray<bool>::Append(&this->m_H,&local_85);
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_Mesh::AppendDuplicateVertex(
  unsigned int vertex_index
  )
{
  const unsigned int vertex_count = VertexUnsignedCount();

  if ( vertex_index >= vertex_count )
    return ON_UNSET_UINT_INDEX;
  
  if (vertex_count == m_V.UnsignedCount())
  {
    ON_3fPoint V = m_V[vertex_index];
    m_V.Append(V);
  }

  if ( vertex_count == m_dV.UnsignedCount())
  {
    ON_3dPoint D = m_dV[vertex_index];
    m_dV.Append(D);
  }

  if ( vertex_count == m_N.UnsignedCount() )
  {
    ON_3fVector N = m_N[vertex_index];
    m_N.Append(N);
  }

  if ( vertex_count == m_T.UnsignedCount() )
  {
    ON_2fPoint T = m_T[vertex_index];
    m_T.Append(T);
  }

  if ( vertex_count == m_S.UnsignedCount() )
  {
    ON_2dPoint S = m_S[vertex_index];
    m_S.Append(S);
  }

  if ( vertex_count == m_K.UnsignedCount() )
  {
    ON_SurfaceCurvature K = m_K[vertex_index];
    m_K.Append(K);
  }

  if ( vertex_count == m_C.UnsignedCount() )
  {
    ON_Color C = m_C[vertex_index];
    m_C.Append(C);
  }

  if ( vertex_count == m_H.UnsignedCount() )
  {
    bool H = m_H[vertex_index];
    m_H.Append(H);
  }

  return vertex_count;
}